

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  bool bVar1;
  CURLcode CVar2;
  int iVar3;
  time_t tVar4;
  char *__ptr;
  per_transfer *per;
  _Bool _Var5;
  _Bool getadded;
  _Bool local_55;
  uint local_54;
  _Bool *local_50;
  _Bool *local_48;
  CURLSH *local_40;
  CURLM *local_38;
  
  *addedp = false;
  *morep = false;
  local_38 = multi;
  if (((long)(ulong)((uint)global->parallel_max * 2) <= all_pers) ||
     (CVar2 = create_transfer(global,share,addedp), CVar2 == CURLE_OK)) {
    if (transfers == (per_transfer *)0x0) {
      _Var5 = false;
    }
    else {
      _Var5 = false;
      per = transfers;
      local_50 = morep;
      local_48 = addedp;
      local_40 = share;
      do {
        if ((long)(ulong)global->parallel_max <= all_added) {
          _Var5 = true;
          break;
        }
        local_55 = false;
        bVar1 = false;
        if (per->added == false) {
          if ((per->startat == 0) || (tVar4 = time((time_t *)0x0), per->startat <= tVar4)) {
            per->added = true;
            CVar2 = pre_transfer(global,per);
            bVar1 = true;
            if (CVar2 == CURLE_OK) {
              local_54 = (uint)share;
              __ptr = (char *)malloc(0x100);
              if (__ptr == (char *)0x0) {
                share = (CURLSH *)0x1b;
              }
              else {
                curl_easy_setopt(per->curl,0xed,global->parallel_connect ^ 1);
                curl_easy_setopt(per->curl,0x2777,per);
                curl_easy_setopt(per->curl,0x4efb,xferinfo_cb);
                curl_easy_setopt(per->curl,0x2749,per);
                curl_easy_setopt(per->curl,0x2b,0);
                iVar3 = curl_multi_add_handle(local_38,per->curl);
                if (iVar3 == 0) {
                  CVar2 = create_transfer(global,local_40,&local_55);
                }
                else {
                  CVar2 = CURLE_OUT_OF_MEMORY;
                }
                if (CVar2 == CURLE_OK) {
                  *__ptr = '\0';
                  bVar1 = false;
                  curl_easy_setopt(per->curl,0x271a,__ptr);
                  per->errorbuffer = __ptr;
                  per->added = true;
                  all_added = all_added + 1;
                  *local_48 = true;
                  share = (CURLSH *)(ulong)local_54;
                  morep = local_50;
                }
                else {
                  free(__ptr);
                  share = (CURLSH *)(ulong)CVar2;
                  morep = local_50;
                }
              }
            }
            else {
              share = (CURLSH *)(ulong)CVar2;
            }
          }
          else {
            _Var5 = true;
          }
        }
        if (bVar1) {
          return (CURLcode)share;
        }
        per = per->next;
      } while (per != (per_transfer *)0x0);
    }
    *morep = _Var5;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  char *errorbuf;
  *addedp = FALSE;
  *morep = FALSE;
  if(all_pers < (global->parallel_max*2)) {
    result = create_transfer(global, share, addedp);
    if(result)
      return result;
  }
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    bool getadded = FALSE;
    if(per->added)
      /* already added */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }
    per->added = TRUE;

    result = pre_transfer(global, per);
    if(result)
      return result;

    errorbuf = malloc(CURL_ERROR_SIZE);
    if(!errorbuf)
      return CURLE_OUT_OF_MEMORY;

    /* parallel connect means that we do not set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_NOPROGRESS, 0L);
#ifdef DEBUGBUILD
    if(getenv("CURL_FORBID_REUSE"))
      (void)curl_easy_setopt(per->curl, CURLOPT_FORBID_REUSE, 1L);
#endif

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode) {
      DEBUGASSERT(mcode == CURLM_OUT_OF_MEMORY);
      result = CURLE_OUT_OF_MEMORY;
    }

    if(!result)
      result = create_transfer(global, share, &getadded);
    if(result) {
      free(errorbuf);
      return result;
    }
    errorbuf[0] = 0;
    (void)curl_easy_setopt(per->curl, CURLOPT_ERRORBUFFER, errorbuf);
    per->errorbuffer = errorbuf;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping) ? TRUE : FALSE;
  return CURLE_OK;
}